

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::BitpackingInitAnalyze<int>(ColumnData *col_data,PhysicalType type)

{
  BitpackingMode BVar1;
  BlockManager *pBVar2;
  DatabaseInstance *db;
  DBConfig *pDVar3;
  pointer pBVar4;
  pointer *__ptr;
  undefined7 in_register_00000031;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::BitpackingAnalyzeState<int>_*,_false> local_28;
  
  db = ColumnData::GetDatabase((ColumnData *)CONCAT71(in_register_00000031,type));
  pDVar3 = DBConfig::GetConfig(db);
  pBVar2 = *(BlockManager **)(CONCAT71(in_register_00000031,type) + 0x18);
  local_28._M_head_impl = (BitpackingAnalyzeState<int> *)operator_new(0x4860);
  ((local_28._M_head_impl)->super_AnalyzeState).info.block_manager = pBVar2;
  ((local_28._M_head_impl)->super_AnalyzeState)._vptr_AnalyzeState =
       (_func_int **)&PTR__AnalyzeState_02487348;
  ((local_28._M_head_impl)->state).compression_buffer_idx = 0;
  ((local_28._M_head_impl)->state).total_size = 0;
  ((local_28._M_head_impl)->state).data_ptr = (void *)0x0;
  ((local_28._M_head_impl)->state).mode = AUTO;
  ((local_28._M_head_impl)->state).compression_buffer_internal[0] = 0;
  ((local_28._M_head_impl)->state).compression_buffer =
       ((local_28._M_head_impl)->state).compression_buffer_internal + 1;
  ((local_28._M_head_impl)->state).minimum = 0x7fffffff;
  ((local_28._M_head_impl)->state).minimum_delta = 0x7fffffff;
  ((local_28._M_head_impl)->state).maximum = -0x80000000;
  ((local_28._M_head_impl)->state).min_max_diff = 0;
  ((local_28._M_head_impl)->state).maximum_delta = -0x80000000;
  ((local_28._M_head_impl)->state).min_max_delta_diff = 0;
  ((local_28._M_head_impl)->state).delta_offset = 0;
  ((local_28._M_head_impl)->state).all_valid = true;
  ((local_28._M_head_impl)->state).all_invalid = true;
  ((local_28._M_head_impl)->state).can_do_delta = false;
  ((local_28._M_head_impl)->state).can_do_for = false;
  ((local_28._M_head_impl)->state).compression_buffer_idx = 0;
  BVar1 = (pDVar3->options).force_bitpacking_mode;
  pBVar4 = unique_ptr<duckdb::BitpackingAnalyzeState<int>,_std::default_delete<duckdb::BitpackingAnalyzeState<int>_>,_true>
           ::operator->((unique_ptr<duckdb::BitpackingAnalyzeState<int>,_std::default_delete<duckdb::BitpackingAnalyzeState<int>_>,_true>
                         *)&local_28);
  (pBVar4->state).mode = BVar1;
  col_data->_vptr_ColumnData = (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> BitpackingInitAnalyze(ColumnData &col_data, PhysicalType type) {
	auto &config = DBConfig::GetConfig(col_data.GetDatabase());

	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<BitpackingAnalyzeState<T>>(info);
	state->state.mode = config.options.force_bitpacking_mode;

	return std::move(state);
}